

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O2

Var Js::JavascriptOperators::ToNumber(Var aRight,ScriptContext *scriptContext)

{
  bool bVar1;
  Var pvVar2;
  double value;
  
  bVar1 = TaggedInt::Is(aRight);
  if ((ulong)aRight >> 0x32 != 0 || bVar1) {
    return aRight;
  }
  value = JavascriptConversion::ToNumber_Full(aRight,scriptContext);
  pvVar2 = JavascriptNumber::ToVarIntCheck(value,scriptContext);
  return pvVar2;
}

Assistant:

Var JavascriptOperators::ToNumber(Var aRight, ScriptContext* scriptContext)
    {
        JIT_HELPER_REENTRANT_HEADER(Op_ConvNumber_Full);
        if (TaggedInt::Is(aRight) || (JavascriptNumber::Is_NoTaggedIntCheck(aRight)))
        {
            return aRight;
        }

        return JavascriptNumber::ToVarIntCheck(JavascriptConversion::ToNumber_Full(aRight, scriptContext), scriptContext);
        JIT_HELPER_END(Op_ConvNumber_Full);
    }